

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_hashmap_each(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  undefined8 *puVar1;
  jx9_hashmap_node *pNode;
  jx9_value *pArray;
  jx9_value *pValue;
  jx9_value sKey;
  jx9_value jStack_68;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 0x40) != 0)) {
    puVar1 = (undefined8 *)((*apArg)->x).pOther;
    pNode = (jx9_hashmap_node *)puVar1[4];
    if ((pNode != (jx9_hashmap_node *)0x0) &&
       (pArray = jx9_context_new_array(pCtx), pArray != (jx9_value *)0x0)) {
      pValue = HashmapExtractNodeValue(pNode);
      jx9_array_add_strkey_elem(pArray,"1",pValue);
      jx9_array_add_strkey_elem(pArray,"value",pValue);
      if (pNode->iType == 1) {
        jx9MemObjInitFromInt((jx9_vm *)*puVar1,&jStack_68,(pNode->xKey).iKey);
      }
      else {
        jx9MemObjInitFromString((jx9_vm *)*puVar1,&jStack_68,(SyString *)0x0);
        jx9MemObjStringAppend(&jStack_68,(char *)(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte);
      }
      jx9_array_add_elem(pArray,(jx9_value *)0x0,&jStack_68);
      jx9_array_add_strkey_elem(pArray,"key",&jStack_68);
      jx9MemObjRelease(&jStack_68);
      puVar1[4] = pNode->pPrev;
      jx9_result_value(pCtx,pArray);
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9_hashmap_each(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pCur;
	jx9_hashmap *pMap;
	jx9_value *pArray;
	jx9_value *pVal;
	jx9_value sKey;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation that describe the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->pCur == 0 ){
		/* Cursor does not point to anything, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pCur = pMap->pCur;
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pVal = HashmapExtractNodeValue(pCur);
	/* Insert the current value */
	jx9_array_add_strkey_elem(pArray, "1", pVal);
	jx9_array_add_strkey_elem(pArray, "value", pVal);
	/* Make the key */
	if( pCur->iType == HASHMAP_INT_NODE ){
		jx9MemObjInitFromInt(pMap->pVm, &sKey, pCur->xKey.iKey);
	}else{
		jx9MemObjInitFromString(pMap->pVm, &sKey, 0);
		jx9MemObjStringAppend(&sKey, (const char *)SyBlobData(&pCur->xKey.sKey), SyBlobLength(&pCur->xKey.sKey));
	}
	/* Insert the current key */
	jx9_array_add_elem(pArray, 0, &sKey);
	jx9_array_add_strkey_elem(pArray, "key", &sKey);
	jx9MemObjRelease(&sKey);
	/* Advance the cursor */
	pMap->pCur = pCur->pPrev; /* Reverse link */
	/* Return the current entry */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}